

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O1

natwm_error workspace_remove_client(natwm_state *state,workspace *workspace,client *client)

{
  list *node;
  natwm_error nVar1;
  
  node = workspace->clients;
  do {
    node = (list *)node->head;
    if (node == (list *)0x0) {
      node = (list *)0x0;
      break;
    }
  } while (client->window != *(xcb_window_t *)node->size);
  if (node == (list *)0x0) {
    nVar1 = NOT_FOUND_ERROR;
  }
  else {
    list_remove(workspace->clients,(node *)node);
    node_destroy((node *)node);
    map_delete(state->workspace_list->client_map,client);
    nVar1 = NO_ERROR;
    if (workspace->active_client == client) {
      workspace->active_client = (client *)0x0;
      workspace_reset_focus(state,workspace);
    }
  }
  return nVar1;
}

Assistant:

enum natwm_error workspace_remove_client(struct natwm_state *state, struct workspace *workspace,
                                         struct client *client)
{
        struct node *client_node = get_client_node_from_client(workspace->clients, client);

        if (client_node == NULL) {
                return NOT_FOUND_ERROR;
        }

        list_remove(workspace->clients, client_node);

        node_destroy(client_node);

        map_delete(state->workspace_list->client_map, &client->window);

        if (workspace->active_client == client) {
                workspace->active_client = NULL;

                workspace_reset_focus(state, workspace);
        }

        return NO_ERROR;
}